

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.cpp
# Opt level: O3

void __thiscall PingClient::PingClient(PingClient *this,string *remoteTarget,string *msg)

{
  long lVar1;
  long *plVar2;
  char c;
  undefined1 local_49;
  long *local_48 [2];
  long local_38 [2];
  
  Dashel::Hub::Hub(&this->super_Hub,true);
  *(undefined ***)this = &PTR__Hub_00104cc0;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"udp:port=8766","");
  lVar1 = Dashel::Hub::connect((string *)this);
  if (lVar1 == 0) {
    plVar2 = (long *)0x0;
  }
  else {
    plVar2 = (long *)__dynamic_cast(lVar1,&Dashel::Stream::typeinfo,&Dashel::PacketStream::typeinfo,
                                    0xffffffffffffffff);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  if (plVar2 != (long *)0x0) {
    (**(code **)(*(long *)((long)plVar2 + *(long *)(*plVar2 + -0x18)) + 0x10))
              ((long)plVar2 + *(long *)(*plVar2 + -0x18),(msg->_M_dataplus)._M_p,
               msg->_M_string_length);
    local_49 = 0;
    (**(code **)(*(long *)((long)plVar2 + *(long *)(*plVar2 + -0x18)) + 0x10))
              ((long)plVar2 + *(long *)(*plVar2 + -0x18),&local_49,1);
    Dashel::IPV4Address::IPV4Address((IPV4Address *)local_48,(string *)remoteTarget,0x223d);
    (**(code **)*plVar2)(plVar2,local_48);
    return;
  }
  __assert_fail("packetStream",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/aseba-community[P]dashel/examples/udp.cpp"
                ,0x3a,"PingClient::PingClient(const string &, const string &)");
}

Assistant:

PingClient(const string& remoteTarget, const string& msg)
	{
		PacketStream* packetStream = dynamic_cast<PacketStream*>(connect("udp:port=8766"));
		assert(packetStream);

		packetStream->write(msg.c_str(), msg.length());
		char c = 0;
		packetStream->write(&c, 1);

		packetStream->send(IPV4Address(remoteTarget, 8765));
	}